

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

LargeObjectHeader * __thiscall
Memory::LargeHeapBlock::GetHeader(LargeHeapBlock *this,void *objectAddress)

{
  LargeObjectHeader *pLVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LargeObjectHeader *pLVar5;
  
  if ((this->pageHeapData == (PageHeapData *)0x0) ||
     (this->pageHeapData->pageHeapMode == PageHeapModeOff)) {
    if ((objectAddress < (this->super_HeapBlock).address) || (this->addressEnd <= objectAddress)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x3b1,
                         "(objectAddress >= this->address && objectAddress < this->addressEnd)",
                         "objectAddress >= this->address && objectAddress < this->addressEnd");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    pLVar5 = (LargeObjectHeader *)((long)objectAddress + -0x20);
  }
  else {
    pLVar1 = (LargeObjectHeader *)(this->super_HeapBlock).address;
    pLVar5 = (LargeObjectHeader *)0x0;
    if ((long)objectAddress - (long)pLVar1 == 0x20) {
      pLVar5 = pLVar1;
    }
  }
  return pLVar5;
}

Assistant:

LargeObjectHeader *
LargeHeapBlock::GetHeader(void * objectAddress) const
{
    LargeObjectHeader * header = nullptr;
#ifdef RECYCLER_PAGE_HEAP
    if (this->InPageHeapMode())
    {
        header = (LargeObjectHeader*)this->address;
        if ((char*)objectAddress - (char*)header != sizeof(LargeObjectHeader))
        {
            header = nullptr;
        }
    }
    else
#endif
    {
        Assert(objectAddress >= this->address && objectAddress < this->addressEnd);
        header = GetHeaderFromAddress(objectAddress);
    }
    return header;
}